

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteHie(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int c;
  char *pFileName;
  char *pBaseName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  glo_fMapped = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"mh"), iVar1 != -1) {
    if ((iVar1 == 0x68) || (iVar1 != 0x6d)) goto LAB_003392a0;
    glo_fMapped = glo_fMapped ^ 1;
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    fprintf((FILE *)pAbc->Out,"Empty network.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind + 2) {
    Io_WriteHie(pAbc->pNtkCur,argv[globalUtilOptind],argv[globalUtilOptind + 1]);
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_003392a0:
    fprintf((FILE *)pAbc->Err,"usage: write_hie [-h] <orig> <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         writes the current network into <file> by calling\n");
    fprintf((FILE *)pAbc->Err,
            "\t         the hierarchical writer that matches the extension of <file>\n");
    pcVar2 = "no";
    if (glo_fMapped != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-m     : toggle reading mapped Verilog for <orig> [default = %s]\n"
            ,pcVar2);
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,
            "\torig   : the name of the original file with the hierarchical design\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteHie( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pBaseName, * pFileName;
    int c;

    glo_fMapped = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                glo_fMapped ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 2 )
        goto usage;
    // get the output file name
    pBaseName = argv[globalUtilOptind];
    pFileName = argv[globalUtilOptind+1];
    // call the corresponding file writer
//    Io_Write( pAbc->pNtkCur, pFileName, Io_ReadFileType(pFileName) );
    Io_WriteHie( pAbc->pNtkCur, pBaseName, pFileName );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_hie [-h] <orig> <file>\n" );
    fprintf( pAbc->Err, "\t         writes the current network into <file> by calling\n" );
    fprintf( pAbc->Err, "\t         the hierarchical writer that matches the extension of <file>\n" );
    fprintf( pAbc->Err, "\t-m     : toggle reading mapped Verilog for <orig> [default = %s]\n", glo_fMapped? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\torig   : the name of the original file with the hierarchical design\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}